

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O3

bool __thiscall stick::Error::operator==(Error *this,Error *_other)

{
  long lVar1;
  int iVar2;
  long local_f0;
  int local_e8;
  long local_e0;
  long local_d0;
  long *local_c8;
  long local_c0;
  undefined8 uStack_b8;
  long local_b0;
  long *local_a8;
  long local_98;
  long local_90;
  long local_88;
  long local_78;
  long *local_70;
  long local_68;
  undefined8 uStack_60;
  long local_58;
  long *local_50;
  long local_40;
  long local_38;
  
  (*this->m_category->_vptr_ErrorCategory[2])(&local_f0,this->m_category,this);
  (*_other->m_category->_vptr_ErrorCategory[2])(&local_98,_other->m_category,_other);
  iVar2 = (int)local_90;
  lVar1 = local_98;
  if (local_68 != 0) {
    local_38 = local_58 + 1;
    local_40 = local_68;
    (**(code **)(*local_50 + 0x18))();
    local_68 = 0;
    uStack_60 = 0;
    local_58 = 0;
  }
  if (local_88 != 0) {
    local_38 = local_78 + 1;
    local_40 = local_88;
    (**(code **)(*local_70 + 0x18))();
  }
  if (local_c0 != 0) {
    local_90 = local_b0 + 1;
    local_98 = local_c0;
    (**(code **)(*local_a8 + 0x18))();
    local_c0 = 0;
    uStack_b8 = 0;
    local_b0 = 0;
  }
  if (local_e0 != 0) {
    local_90 = local_d0 + 1;
    local_98 = local_e0;
    (**(code **)(*local_c8 + 0x18))();
  }
  return local_f0 == lVar1 && local_e8 == iVar2;
}

Assistant:

bool Error::operator==(const Error & _other) const
{
    Error a = resolvedCode();
    Error b = _other.resolvedCode();
    return a.m_code == b.m_code && a.m_category == b.m_category;
}